

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyjson.h
# Opt level: O2

void __thiscall
tinyjson::json_node::_serialize
          (json_node *this,int indent,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *iter,uint indent_size)

{
  long lVar1;
  byte bVar2;
  pointer ppjVar3;
  array *paVar4;
  array *paVar5;
  pointer ppjVar6;
  long lVar7;
  size_t sVar8;
  uint uVar9;
  char *pcVar10;
  byte *pbVar11;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  int iVar12;
  long lVar13;
  char cVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  byte bVar18;
  const_iterator citer;
  pointer ppjVar19;
  array *paVar20;
  char *pcVar21;
  int iVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  double dVar26;
  double dVar27;
  double local_88;
  double local_78;
  char buf [32];
  
  switch(this->type) {
  case null_type:
    pcVar21 = _serialize::n + 4;
    __result = (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )iter->container;
    pcVar10 = _serialize::n;
    goto LAB_00103eb0;
  case boolean_type:
    __result = (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )iter->container;
    if ((this->storage).bool_val == true) {
      pcVar21 = _serialize::t + 4;
      pcVar10 = _serialize::t;
    }
    else {
      pcVar21 = _serialize::f + 5;
      pcVar10 = _serialize::f;
    }
LAB_00103eb0:
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::string>>(pcVar10,pcVar21,__result);
    return;
  case number_type:
    local_78 = (this->storage).num_val;
    if (NAN(local_78)) {
      builtin_strncpy(buf,"nan",4);
    }
    else if (ABS(local_78) == INFINITY) {
      builtin_strncpy(buf,"inf",4);
    }
    else if ((local_78 != 0.0) || (NAN(local_78))) {
      dVar26 = -local_78;
      bVar23 = local_78 < dVar26;
      local_88 = dVar26;
      if (dVar26 <= local_78) {
        local_88 = local_78;
      }
      dVar27 = log10(local_88);
      iVar22 = (int)dVar27;
      bVar24 = iVar22 - 0xeU < 0xffffffea;
      if (dVar26 <= local_78) {
        pcVar21 = buf;
      }
      else {
        pcVar21 = buf + 1;
        buf[0] = '-';
      }
      if (!bVar24 && (8 >= iVar22 || dVar26 <= local_78)) {
        iVar12 = 0;
        if (0 < iVar22) {
          iVar12 = iVar22;
        }
      }
      else {
        uVar9 = (iVar22 >> 0x1f) + iVar22;
        local_78 = (double)(ulong)uVar9;
        dVar26 = pow(10.0,(double)(int)uVar9);
        local_88 = local_88 / dVar26;
        iVar12 = 0;
      }
      while ((1e-14 < local_88 || (-1 < iVar12))) {
        dVar27 = pow(10.0,(double)iVar12);
        dVar26 = ABS(dVar27);
        if (((dVar26 != INFINITY && (dVar26 != 0.0 && (ulong)dVar26 < 0x7ff0000000000000)) &&
            (0xffffffffffffe < (long)dVar26 - 1U || -1 < (long)dVar27)) &&
            (0x3fe < (uint)((long)dVar26 + 0xfff0000000000000U >> 0x35) || -1 < (long)dVar27)) {
          dVar26 = floor(local_88 / dVar27);
          local_88 = local_88 - (double)(int)dVar26 * dVar27;
          *pcVar21 = (char)(int)dVar26 + '0';
          pcVar21 = pcVar21 + 1;
        }
        bVar25 = iVar12 == 0;
        iVar12 = iVar12 + -1;
        if ((bVar25) && (0.0 < local_88)) {
          *pcVar21 = '.';
          pcVar21 = pcVar21 + 1;
        }
      }
      pcVar10 = pcVar21;
      if (bVar24 || 8 < iVar22 && bVar23) {
        pcVar10 = pcVar21 + 1;
        *pcVar21 = 'e';
        uVar9 = -local_78._0_4_;
        if (0 < (int)local_78._0_4_) {
          uVar9 = local_78._0_4_;
        }
        pcVar21[1] = ((int)local_78._0_4_ < 1) * '\x02' + '+';
        uVar15 = 0;
        lVar13 = 2;
        for (; uVar9 != 0; uVar9 = uVar9 / 10) {
          pcVar21[lVar13] = (byte)((ulong)uVar9 % 10) | 0x30;
          pcVar10 = pcVar10 + 2;
          uVar15 = uVar15 + 1;
          lVar13 = lVar13 + 1;
        }
        uVar16 = (ulong)uVar15;
        pbVar11 = (byte *)(pcVar10 + -uVar16);
        lVar7 = lVar13 + -3;
        pcVar10 = pcVar21 + lVar13;
        for (lVar17 = 0; lVar17 < lVar7; lVar17 = lVar17 + 1) {
          lVar1 = lVar13 + lVar17;
          bVar18 = pcVar21[lVar1 - uVar16];
          bVar2 = *pbVar11;
          pcVar21[lVar1 - uVar16] = bVar18 ^ bVar2;
          bVar18 = bVar18 ^ bVar2 ^ *pbVar11;
          *pbVar11 = bVar18;
          pcVar21[lVar1 - uVar16] = pcVar21[lVar1 - uVar16] ^ bVar18;
          pbVar11 = pbVar11 + -1;
          lVar7 = lVar7 + -1;
        }
      }
      *pcVar10 = '\0';
    }
    else {
      buf[0] = '0';
      buf[1] = '\0';
    }
    sVar8 = strlen(buf);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::string>>
              (buf,buf + sVar8,
               (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )iter->container);
    return;
  case string_type:
    paVar4 = (this->storage).array_val;
    std::__cxx11::string::push_back((char)iter->container);
    ppjVar6 = (paVar4->
              super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::string>>
              ((char *)ppjVar6,
               (char *)((long)ppjVar6 +
                       (long)(paVar4->
                             super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                             )._M_impl.super__Vector_impl_data._M_finish),
               (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )iter->container);
    cVar14 = (char)iter->container;
    break;
  case array_type:
    std::__cxx11::string::push_back((char)iter->container);
    iVar22 = -1;
    if (indent + 1 != 0) {
      iVar22 = indent + 1;
    }
    ppjVar3 = (((this->storage).array_val)->
              super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    ppjVar6 = (((this->storage).array_val)->
              super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    for (ppjVar19 = ppjVar6; ppjVar19 != ppjVar3; ppjVar19 = ppjVar19 + 1) {
      if (ppjVar19 != ppjVar6) {
        std::__cxx11::string::push_back((char)iter->container);
      }
      if (iVar22 != -1) {
        std::__cxx11::string::push_back((char)iter->container);
        iVar12 = iVar22 * indent_size;
        while (bVar23 = iVar12 != 0, iVar12 = iVar12 + -1, bVar23) {
          std::__cxx11::string::push_back((char)iter->container);
        }
      }
      _serialize(*ppjVar19,iVar22,iter,indent_size);
    }
    if ((iVar22 != -1) &&
       ((((this->storage).array_val)->
        super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>)._M_impl.
        super__Vector_impl_data._M_start !=
        (((this->storage).array_val)->
        super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>)._M_impl.
        super__Vector_impl_data._M_finish)) {
      iVar22 = (iVar22 + -1) * indent_size;
      std::__cxx11::string::push_back((char)iter->container);
      while (bVar23 = iVar22 != 0, iVar22 = iVar22 + -1, bVar23) {
        std::__cxx11::string::push_back((char)iter->container);
      }
    }
    cVar14 = (char)iter->container;
    break;
  case object_type:
    std::__cxx11::string::push_back((char)iter->container);
    iVar22 = -1;
    if (indent + 1 != 0) {
      iVar22 = indent + 1;
    }
    paVar4 = (this->storage).array_val;
    paVar5 = (array *)(paVar4->
                      super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    for (paVar20 = paVar5; paVar20 != paVar4;
        paVar20 = (array *)(paVar20->
                           super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                           )._M_impl.super__Vector_impl_data._M_start) {
      if (paVar20 != paVar5) {
        std::__cxx11::string::push_back((char)iter->container);
      }
      if (iVar22 == -1) {
        std::__cxx11::string::push_back((char)iter->container);
        ppjVar6 = (paVar20->
                  super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>)
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::string>>
                  ((char *)ppjVar6,
                   (char *)((long)ppjVar6 +
                           (long)paVar20[1].
                                 super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start),
                   (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )iter->container);
      }
      else {
        std::__cxx11::string::push_back((char)iter->container);
        iVar12 = iVar22 * indent_size;
        while (bVar23 = iVar12 != 0, iVar12 = iVar12 + -1, bVar23) {
          std::__cxx11::string::push_back((char)iter->container);
        }
        std::__cxx11::string::push_back((char)iter->container);
        ppjVar6 = (paVar20->
                  super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>)
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::string>>
                  ((char *)ppjVar6,
                   (char *)((long)ppjVar6 +
                           (long)paVar20[1].
                                 super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start),
                   (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )iter->container);
        std::__cxx11::string::push_back((char)iter->container);
      }
      std::__cxx11::string::push_back((char)iter->container);
      std::__cxx11::string::push_back((char)iter->container);
      _serialize((json_node *)
                 paVar20[2].
                 super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,iVar22,iter,indent_size);
    }
    if ((iVar22 != -1) &&
       ((array *)(((this->storage).array_val)->
                 super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>).
                 _M_impl.super__Vector_impl_data._M_start != (this->storage).array_val)) {
      iVar22 = (iVar22 + -1) * indent_size;
      std::__cxx11::string::push_back((char)iter->container);
      while (bVar23 = iVar22 != 0, iVar22 = iVar22 + -1, bVar23) {
        std::__cxx11::string::push_back((char)iter->container);
      }
    }
    cVar14 = (char)iter->container;
    break;
  default:
    return;
  }
  std::__cxx11::string::push_back(cVar14);
  return;
}

Assistant:

void _serialize(int indent, std::back_insert_iterator<string>& iter, unsigned int indent_size) const {
      switch (type) {
        case node_type::string_type:
          serialize_str(*(storage.str_val), iter);
          break;
        case node_type::object_type: {
          iter++ = '{';
          if (indent != -1) {
            ++indent;
          }
          auto cbegin = storage.object_val->cbegin();
          auto cend = storage.object_val->cend();
          for (auto citer = cbegin; citer != cend; ++citer) {
            if (citer != cbegin) {
              iter++ = ',';
            }
            if (indent != -1) {
              make_indent(indent, iter, indent_size);
            }
            serialize_str(citer->first, iter);
            iter++ = ':';
            if (indent != -1) {
              iter++ = ' ';
            }
            citer->second->_serialize(indent, iter, indent_size);
          }
          if (indent != -1) {
            --indent;
            if (!storage.object_val->empty()) {
              make_indent(indent, iter, indent_size);
            }
          }
          iter++ = '}';
          break;
        }
        case node_type::array_type: {
          iter++ = '[';
          if (indent != -1) {
            ++indent;
          }
          auto cbegin = storage.array_val->cbegin();
          auto cend = storage.array_val->cend();
          for (auto citer = cbegin; citer != cend; ++citer) {
            if (citer != cbegin) {
              iter++ = ',';
            }
            if (indent != -1) {
              make_indent(indent, iter, indent_size);
            }
            (*citer)->_serialize(indent, iter, indent_size);
          }
          if (indent != -1) {
            --indent;
            if (!storage.array_val->empty()) {
              make_indent(indent, iter, indent_size);
            }
          }
          iter++ = ']';
          break;
        }
        case node_type::null_type: {
		      static const char* n = "null";
          std::copy(n, n + 4, iter);
          break;
		    }
        case node_type::number_type: {
          char buf[MAX_NUMBER_STRING_SIZE];
          const char* c = dtoa(buf, storage.num_val);
          std::copy(c, c + strlen(c), iter);
          break;
        }
        case node_type::boolean_type: {
		      static const char* t = "true";
          static const char* f = "false";
          if (storage.bool_val) {
            std::copy(t, t + 4, iter);
          } else {
            std::copy(f, f + 5, iter);
          }
          break;
		    }
      }
    }